

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFontAtlas::ClearInputData(ImFontAtlas *this)

{
  ImFontConfig *pIVar1;
  void *ptr;
  ImFont **ppIVar2;
  ImFontConfig_conflict *pIVar3;
  ImFont *pIVar4;
  ImFontConfig_conflict *pIVar5;
  ImFontAtlasCustomRect *ptr_00;
  char *pcVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  
  if (this->Locked != false) {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                  ,0x7c5,"void ImFontAtlas::ClearInputData()");
  }
  iVar7 = (this->ConfigData).Size;
  if (0 < iVar7) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      pIVar1 = (this->ConfigData).Data;
      ptr = *(void **)(pIVar1->Name + lVar8 + -0x56);
      if ((ptr != (void *)0x0) && (pIVar1->Name[lVar8 + -0x4a] == '\x01')) {
        ImGui::MemFree(ptr);
        if ((this->ConfigData).Size <= lVar9) {
          pcVar6 = "T &ImVector<ImFontConfig>::operator[](int) [T = ImFontConfig]";
          goto LAB_001cc750;
        }
        pcVar6 = ((this->ConfigData).Data)->Name + lVar8 + -0x56;
        pcVar6[0] = '\0';
        pcVar6[1] = '\0';
        pcVar6[2] = '\0';
        pcVar6[3] = '\0';
        pcVar6[4] = '\0';
        pcVar6[5] = '\0';
        pcVar6[6] = '\0';
        pcVar6[7] = '\0';
      }
      lVar9 = lVar9 + 1;
      iVar7 = (this->ConfigData).Size;
      lVar8 = lVar8 + 0x88;
    } while (lVar9 < iVar7);
  }
  lVar8 = (long)(this->Fonts).Size;
  if (0 < lVar8) {
    ppIVar2 = (this->Fonts).Data;
    pIVar3 = (ImFontConfig_conflict *)(this->ConfigData).Data;
    lVar9 = 0;
    do {
      pIVar4 = ppIVar2[lVar9];
      pIVar5 = pIVar4->ConfigData;
      if ((pIVar3 <= pIVar5) && (pIVar5 < pIVar3 + iVar7)) {
        pIVar4->ConfigData = (ImFontConfig_conflict *)0x0;
        if ((this->Fonts).Size <= lVar9) {
          pcVar6 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_001cc750:
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                        ,0x706,pcVar6);
        }
        ppIVar2[lVar9]->ConfigDataCount = 0;
      }
      lVar9 = lVar9 + 1;
    } while (lVar8 != lVar9);
  }
  pIVar1 = (this->ConfigData).Data;
  if (pIVar1 != (ImFontConfig *)0x0) {
    (this->ConfigData).Size = 0;
    (this->ConfigData).Capacity = 0;
    ImGui::MemFree(pIVar1);
    (this->ConfigData).Data = (ImFontConfig *)0x0;
  }
  ptr_00 = (this->CustomRects).Data;
  if (ptr_00 != (ImFontAtlasCustomRect *)0x0) {
    (this->CustomRects).Size = 0;
    (this->CustomRects).Capacity = 0;
    ImGui::MemFree(ptr_00);
    (this->CustomRects).Data = (ImFontAtlasCustomRect *)0x0;
  }
  this->PackIdMouseCursors = -1;
  this->PackIdLines = -1;
  return;
}

Assistant:

void    ImFontAtlas::ClearInputData()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (int i = 0; i < ConfigData.Size; i++)
        if (ConfigData[i].FontData && ConfigData[i].FontDataOwnedByAtlas)
        {
            IM_FREE(ConfigData[i].FontData);
            ConfigData[i].FontData = NULL;
        }

    // When clearing this we lose access to the font name and other information used to build the font.
    for (int i = 0; i < Fonts.Size; i++)
        if (Fonts[i]->ConfigData >= ConfigData.Data && Fonts[i]->ConfigData < ConfigData.Data + ConfigData.Size)
        {
            Fonts[i]->ConfigData = NULL;
            Fonts[i]->ConfigDataCount = 0;
        }
    ConfigData.clear();
    CustomRects.clear();
    PackIdMouseCursors = PackIdLines = -1;
    // Important: we leave TexReady untouched
}